

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::BeginCombo(char *label,char *preview_value,ImGuiComboFlags flags)

{
  undefined8 uVar1;
  ImGuiContext *pIVar2;
  ImGuiID IVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ImU32 col;
  ImGuiWindow *pIVar7;
  uint uVar8;
  ImGuiContext *g;
  ImDrawCornerFlags rounding_corners;
  uint uVar9;
  undefined1 auVar10 [16];
  float fVar11;
  undefined4 extraout_XMM0_Db;
  ImVec2 IVar12;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined8 extraout_XMM0_Qb;
  undefined1 extraout_var [12];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 extraout_var_00 [56];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  ImRect IVar25;
  bool hovered;
  bool held;
  ImRect frame_bb;
  char name [16];
  ImVec2 size_expected;
  ImRect r_outer;
  ImVec2 pos;
  ImRect total_bb;
  bool local_102;
  char local_101;
  float local_100;
  bool local_f9;
  ImRect local_f8;
  ImGuiID local_dc;
  ImVec2 local_d8 [2];
  undefined1 local_c8 [16];
  ImU32 local_b8;
  uint local_b4;
  ImVec2 local_b0;
  undefined1 local_a8 [16];
  float local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  float local_88;
  float fStack_84;
  undefined8 uStack_80;
  char *local_70;
  char *local_68;
  ImVec2 local_60;
  ImRect local_58;
  ImVec2 local_48;
  ImRect local_40;
  undefined1 auVar18 [56];
  undefined1 extraout_var_01 [56];
  undefined1 auVar21 [56];
  
  pIVar2 = GImGui;
  uVar9 = (GImGui->NextWindowData).Flags;
  (GImGui->NextWindowData).Flags = uVar9 & 0xffffffef;
  pIVar7 = pIVar2->CurrentWindow;
  pIVar7->WriteAccessed = true;
  if (pIVar7->SkipItems != false) {
    return false;
  }
  local_68 = preview_value;
  local_dc = ImGuiWindow::GetID(pIVar7,label,(char *)0x0);
  local_98 = 0.0;
  uStack_94 = 0;
  uStack_90 = 0;
  uStack_8c = 0;
  if ((flags & 0x20U) == 0) {
    local_98 = GetFrameHeight();
    uStack_94 = extraout_XMM0_Db;
    uStack_90 = extraout_XMM0_Dc;
    uStack_8c = extraout_XMM0_Dd;
  }
  local_70 = label;
  IVar12 = CalcTextSize(label,(char *)0x0,true,-1.0);
  local_88 = IVar12.x;
  fStack_84 = IVar12.y;
  uStack_80 = extraout_XMM0_Qb;
  fVar11 = CalcItemWidth();
  auVar15._4_4_ = fStack_84;
  auVar15._0_4_ = local_88;
  auVar15._8_8_ = uStack_80;
  IVar12 = (pIVar7->DC).CursorPos;
  auVar10._8_8_ = 0;
  auVar10._0_4_ = IVar12.x;
  auVar10._4_4_ = IVar12.y;
  fVar24 = 0.0;
  uVar8 = (flags & 0x40U) >> 6;
  bVar6 = SUB41(uVar8,0);
  local_a8._0_4_ = uVar8 * (int)local_98 + (uint)!bVar6 * (int)fVar11;
  local_a8._4_12_ = extraout_var;
  fVar11 = (pIVar2->Style).FramePadding.y;
  auVar15 = vmovshdup_avx(auVar15);
  auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar11),ZEXT416(0x40000000));
  auVar15 = vinsertps_avx(local_a8,auVar15,0x10);
  auVar22._0_4_ = auVar15._0_4_ + IVar12.x;
  auVar22._4_4_ = auVar15._4_4_ + IVar12.y;
  auVar22._8_4_ = auVar15._8_4_ + 0.0;
  auVar22._12_4_ = auVar15._12_4_ + 0.0;
  local_f8 = (ImRect)vmovlhps_avx(auVar10,auVar22);
  if (0.0 < local_88) {
    fVar24 = local_88 + (pIVar2->Style).ItemInnerSpacing.x;
  }
  auVar23._0_4_ = fVar24 + auVar22._0_4_;
  auVar23._4_4_ = auVar22._4_4_ + 0.0;
  auVar23._8_4_ = auVar22._8_4_ + 0.0;
  auVar23._12_4_ = auVar22._12_4_ + 0.0;
  local_40 = (ImRect)vmovlhps_avx(auVar10,auVar23);
  ItemSize(&local_40,fVar11);
  IVar3 = local_dc;
  bVar4 = ItemAdd(&local_40,local_dc,&local_f8);
  if (!bVar4) {
    return false;
  }
  local_b4 = uVar9;
  local_101 = ButtonBehavior(&local_f8,IVar3,&local_102,&local_f9,0);
  bVar5 = IsPopupOpen(IVar3);
  local_b8 = GetColorU32(local_102 + 7,1.0);
  local_c8 = ZEXT416((uint)local_f8.Min.x);
  local_100 = local_f8.Max.x;
  RenderNavHighlight(&local_f8,IVar3,1);
  uVar1 = vcmpss_avx512f(ZEXT416((uint)(local_100 - local_98)),local_c8,2);
  bVar4 = (bool)((byte)uVar1 & 1);
  fVar11 = (float)((uint)bVar4 * local_c8._0_4_ + (uint)!bVar4 * (int)(local_100 - local_98));
  local_c8 = ZEXT416((uint)fVar11);
  if ((flags & 0x40U) == 0) {
    rounding_corners = 0xf;
    if ((flags & 0x20U) == 0) {
      rounding_corners = 5;
    }
    local_d8[0].y = local_f8.Max.y;
    local_d8[0].x = fVar11;
    ImDrawList::AddRectFilled
              (pIVar7->DrawList,&local_f8.Min,local_d8,local_b8,(pIVar2->Style).FrameRounding,
               rounding_corners);
  }
  if ((flags & 0x20U) == 0) {
    col = GetColorU32(((byte)(local_102 | bVar5) & 1) + 0x15,1.0);
    local_100 = (float)GetColorU32(0,1.0);
    local_d8[0].y = local_f8.Min.y;
    local_d8[0].x = (float)local_c8._0_4_;
    ImDrawList::AddRectFilled
              (pIVar7->DrawList,local_d8,&local_f8.Max,col,(pIVar2->Style).FrameRounding,
               (uint)((float)local_a8._0_4_ <= local_98) * 5 + 10);
    if (((float)local_c8._0_4_ + local_98) - (pIVar2->Style).FramePadding.x <= local_f8.Max.x) {
      fVar11 = (pIVar2->Style).FramePadding.y;
      auVar15 = vinsertps_avx(ZEXT416((uint)(fVar11 + (float)local_c8._0_4_)),
                              ZEXT416((uint)(fVar11 + local_f8.Min.y)),0x10);
      RenderArrow(pIVar7->DrawList,auVar15._0_8_,(ImU32)local_100,3,1.0);
    }
  }
  RenderFrameBorder(local_f8.Min,local_f8.Max,(pIVar2->Style).FrameRounding);
  uVar9 = local_b4;
  if (local_68 != (char *)0x0 && bVar6 == false) {
    IVar12 = (pIVar2->Style).FramePadding;
    local_b0.x = 0.0;
    local_b0.y = 0.0;
    auVar13._0_4_ = local_f8.Min.x + IVar12.x;
    auVar13._4_4_ = local_f8.Min.y + IVar12.y;
    auVar13._8_8_ = 0;
    local_d8[0] = (ImVec2)vmovlps_avx(auVar13);
    local_58.Min.y = local_f8.Max.y;
    local_58.Min.x = (float)local_c8._0_4_;
    RenderTextClipped(local_d8,&local_58.Min,local_68,(char *)0x0,(ImVec2 *)0x0,&local_b0,
                      (ImRect *)0x0);
  }
  IVar3 = local_dc;
  IVar25 = local_f8;
  if (0.0 < local_88) {
    auVar14._8_8_ = 0;
    auVar14._0_4_ = local_f8.Min.y;
    auVar14._4_4_ = local_f8.Max.x;
    auVar10 = vpermi2ps_avx512vl(_DAT_0029b6f0,ZEXT416((uint)(pIVar2->Style).FramePadding.y),
                                 ZEXT416((uint)(pIVar2->Style).ItemInnerSpacing.x));
    auVar15 = vshufps_avx(auVar14,auVar14,0xe1);
    IVar12.x = auVar15._0_4_ + auVar10._0_4_;
    IVar12.y = auVar15._4_4_ + auVar10._4_4_;
    local_f8 = IVar25;
    RenderText(IVar12,local_70,(char *)0x0,true);
  }
  if (local_101 == '\0') {
    if (pIVar2->NavActivateId == IVar3 && !bVar5) {
LAB_0024f305:
      if ((pIVar7->DC).NavLayerCurrent == ImGuiNavLayer_Main) {
        pIVar7->NavLastIds[0] = IVar3;
      }
      OpenPopupEx(IVar3);
    }
    else if (!bVar5) {
      return false;
    }
  }
  else if (!bVar5) goto LAB_0024f305;
  if ((uVar9 & 0x10) != 0) {
    *(byte *)&(pIVar2->NextWindowData).Flags = (byte)(pIVar2->NextWindowData).Flags | 0x10;
    fVar11 = (pIVar2->NextWindowData).SizeConstraintRect.Min.x;
    uVar1 = vcmpss_avx512f(local_a8,ZEXT416((uint)fVar11),2);
    bVar6 = (bool)((byte)uVar1 & 1);
    auVar21 = ZEXT856(local_a8._8_8_);
    (pIVar2->NextWindowData).SizeConstraintRect.Min.x =
         (float)((uint)bVar6 * (int)fVar11 + (uint)!bVar6 * local_a8._0_4_);
    goto LAB_0024f40f;
  }
  uVar9 = flags | 4;
  if ((flags & 0x1eU) != 0) {
    uVar9 = flags;
  }
  if ((uVar9 & 4) == 0) {
    if ((uVar9 & 2) != 0) {
      auVar15 = SUB6416(ZEXT464(0x40800000),0);
      goto LAB_0024f3b1;
    }
    if ((uVar9 & 8) != 0) {
      auVar15 = SUB6416(ZEXT464(0x41a00000),0);
      goto LAB_0024f3b1;
    }
    auVar19 = ZEXT464(0x7f7fffff);
  }
  else {
    auVar15 = SUB6416(ZEXT464(0x41000000),0);
LAB_0024f3b1:
    fVar11 = (GImGui->Style).ItemSpacing.y;
    auVar15 = vfmsub213ss_fma(ZEXT416((uint)(fVar11 + GImGui->FontSize)),auVar15,
                              ZEXT416((uint)fVar11));
    auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)(GImGui->Style).WindowPadding.y),
                              ZEXT416(0x40000000));
    auVar19 = ZEXT1664(auVar15);
  }
  local_d8[0].y = 0.0;
  local_d8[0].x = (float)local_a8._0_4_;
  auVar21 = auVar19._8_56_;
  local_58.Min.y = auVar19._0_4_;
  local_58.Min.x = 3.4028235e+38;
  SetNextWindowSizeConstraints(local_d8,&local_58.Min,(ImGuiSizeCallback)0x0,(void *)0x0);
  flags = uVar9;
LAB_0024f40f:
  ImFormatString((char *)local_d8,0x10,"##Combo_%02d",(ulong)(uint)(pIVar2->BeginPopupStack).Size);
  pIVar7 = FindWindowByName((char *)local_d8);
  if ((pIVar7 != (ImGuiWindow *)0x0) && (pIVar7->WasActive == true)) {
    auVar19._0_8_ = CalcWindowExpectedSize(pIVar7);
    auVar19._8_56_ = extraout_var_00;
    local_b0 = (ImVec2)vmovlps_avx(auVar19._0_16_);
    if ((flags & 1U) != 0) {
      pIVar7->AutoPosLastDirection = 0;
    }
    auVar18 = extraout_var_00;
    IVar25 = GetWindowAllowedExtentRect(pIVar7);
    auVar20._0_8_ = IVar25.Max;
    auVar20._8_56_ = auVar21;
    auVar16._0_8_ = IVar25.Min;
    auVar16._8_56_ = auVar18;
    local_58 = (ImRect)vmovlhps_avx(auVar16._0_16_,auVar20._0_16_);
    auVar15 = vinsertps_avx((undefined1  [16])local_f8,ZEXT416((uint)local_f8.Max.y),0x10);
    local_60 = (ImVec2)vmovlps_avx(auVar15);
    auVar17._0_8_ =
         FindBestWindowPosForPopupEx
                   (&local_60,&local_b0,&pIVar7->AutoPosLastDirection,&local_58,&local_f8,
                    ImGuiPopupPositionPolicy_ComboBox);
    auVar17._8_56_ = extraout_var_01;
    local_60.x = 0.0;
    local_60.y = 0.0;
    local_48 = (ImVec2)vmovlps_avx(auVar17._0_16_);
    SetNextWindowPos(&local_48,0,&local_60);
  }
  local_58.Min.y = (pIVar2->Style).WindowPadding.y;
  local_58.Min.x = (pIVar2->Style).FramePadding.x;
  PushStyleVar(1,&local_58.Min);
  bVar6 = Begin((char *)local_d8,(bool *)0x0,0x4000147);
  PopStyleVar(1);
  if (!bVar6) {
    EndPopup();
    return bVar6;
  }
  return bVar6;
}

Assistant:

bool ImGui::BeginCombo(const char* label, const char* preview_value, ImGuiComboFlags flags)
{
    // Always consume the SetNextWindowSizeConstraint() call in our early return paths
    ImGuiContext& g = *GImGui;
    bool has_window_size_constraint = (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint) != 0;
    g.NextWindowData.Flags &= ~ImGuiNextWindowDataFlags_HasSizeConstraint;

    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    IM_ASSERT((flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)); // Can't use both flags together

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const float arrow_size = (flags & ImGuiComboFlags_NoArrowButton) ? 0.0f : GetFrameHeight();
    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const float expected_w = CalcItemWidth();
    const float w = (flags & ImGuiComboFlags_NoPreview) ? arrow_size : expected_w;
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y*2.0f));
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &frame_bb))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(frame_bb, id, &hovered, &held);
    bool popup_open = IsPopupOpen(id);

    const ImU32 frame_col = GetColorU32(hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    const float value_x2 = ImMax(frame_bb.Min.x, frame_bb.Max.x - arrow_size);
    RenderNavHighlight(frame_bb, id);
    if (!(flags & ImGuiComboFlags_NoPreview))
        window->DrawList->AddRectFilled(frame_bb.Min, ImVec2(value_x2, frame_bb.Max.y), frame_col, style.FrameRounding, (flags & ImGuiComboFlags_NoArrowButton) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Left);
    if (!(flags & ImGuiComboFlags_NoArrowButton))
    {
        ImU32 bg_col = GetColorU32((popup_open || hovered) ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
        ImU32 text_col = GetColorU32(ImGuiCol_Text);
        window->DrawList->AddRectFilled(ImVec2(value_x2, frame_bb.Min.y), frame_bb.Max, bg_col, style.FrameRounding, (w <= arrow_size) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Right);
        if (value_x2 + arrow_size - style.FramePadding.x <= frame_bb.Max.x)
            RenderArrow(window->DrawList, ImVec2(value_x2 + style.FramePadding.y, frame_bb.Min.y + style.FramePadding.y), text_col, ImGuiDir_Down, 1.0f);
    }
    RenderFrameBorder(frame_bb.Min, frame_bb.Max, style.FrameRounding);
    if (preview_value != NULL && !(flags & ImGuiComboFlags_NoPreview))
        RenderTextClipped(frame_bb.Min + style.FramePadding, ImVec2(value_x2, frame_bb.Max.y), preview_value, NULL, NULL, ImVec2(0.0f,0.0f));
    if (label_size.x > 0)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    if ((pressed || g.NavActivateId == id) && !popup_open)
    {
        if (window->DC.NavLayerCurrent == 0)
            window->NavLastIds[0] = id;
        OpenPopupEx(id);
        popup_open = true;
    }

    if (!popup_open)
        return false;

    if (has_window_size_constraint)
    {
        g.NextWindowData.Flags |= ImGuiNextWindowDataFlags_HasSizeConstraint;
        g.NextWindowData.SizeConstraintRect.Min.x = ImMax(g.NextWindowData.SizeConstraintRect.Min.x, w);
    }
    else
    {
        if ((flags & ImGuiComboFlags_HeightMask_) == 0)
            flags |= ImGuiComboFlags_HeightRegular;
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_));    // Only one
        int popup_max_height_in_items = -1;
        if (flags & ImGuiComboFlags_HeightRegular)     popup_max_height_in_items = 8;
        else if (flags & ImGuiComboFlags_HeightSmall)  popup_max_height_in_items = 4;
        else if (flags & ImGuiComboFlags_HeightLarge)  popup_max_height_in_items = 20;
        SetNextWindowSizeConstraints(ImVec2(w, 0.0f), ImVec2(FLT_MAX, CalcMaxPopupHeightFromItemCount(popup_max_height_in_items)));
    }

    char name[16];
    ImFormatString(name, IM_ARRAYSIZE(name), "##Combo_%02d", g.BeginPopupStack.Size); // Recycle windows based on depth

    // Peak into expected window size so we can position it
    if (ImGuiWindow* popup_window = FindWindowByName(name))
        if (popup_window->WasActive)
        {
            ImVec2 size_expected = CalcWindowExpectedSize(popup_window);
            if (flags & ImGuiComboFlags_PopupAlignLeft)
                popup_window->AutoPosLastDirection = ImGuiDir_Left;
            ImRect r_outer = GetWindowAllowedExtentRect(popup_window);
            ImVec2 pos = FindBestWindowPosForPopupEx(frame_bb.GetBL(), size_expected, &popup_window->AutoPosLastDirection, r_outer, frame_bb, ImGuiPopupPositionPolicy_ComboBox);
            SetNextWindowPos(pos);
        }

    // We don't use BeginPopupEx() solely because we have a custom name string, which we could make an argument to BeginPopupEx()
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_Popup | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoMove;

    // Horizontally align ourselves with the framed text
    PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(style.FramePadding.x, style.WindowPadding.y));
    bool ret = Begin(name, NULL, window_flags);
    PopStyleVar();
    if (!ret)
    {
        EndPopup();
        IM_ASSERT(0);   // This should never happen as we tested for IsPopupOpen() above
        return false;
    }
    return true;
}